

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O3

double __thiscall lda::lgamma(lda *this,double param_1)

{
  lda_math_mode lVar1;
  double dVar2;
  float fVar3;
  ostream *poVar4;
  float fVar5;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar6;
  float fVar7;
  float fVar8;
  lanczos13m53 local_1a;
  policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
  local_19;
  undefined1 local_18 [16];
  
  fVar6 = SUB84(param_1,0);
  lVar1 = this->mmode;
  if (lVar1 != USE_SIMD) {
    if (lVar1 == USE_PRECISE) {
      dVar2 = boost::math::detail::
              lgamma_imp<double,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>,boost::math::lanczos::lanczos13m53>
                        ((double)fVar6,&local_19,&local_1a,(int *)0x0);
      local_18._0_4_ = SUB84(dVar2,0);
      local_18._4_4_ = (undefined4)((ulong)dVar2 >> 0x20);
      if (3.4028234663852886e+38 <= ABS(dVar2) && ABS(dVar2) != 3.4028234663852886e+38) {
        local_18._8_4_ = extraout_XMM0_Dc;
        local_18._0_8_ = dVar2;
        local_18._12_4_ = extraout_XMM0_Dd;
        boost::math::policies::detail::raise_error<std::overflow_error,float>
                  ("boost::math::lgamma<%1%>(%1%)","numeric overflow");
      }
      fVar6 = (float)(double)CONCAT44(local_18._4_4_,local_18._0_4_);
      goto LAB_00195f4b;
    }
    if (lVar1 != USE_FAST_APPROX) {
      poVar4 = std::operator<<((ostream *)&std::cerr,
                               "lda::lgamma: Trampled or invalid math mode, aborting");
      std::endl<char,std::char_traits<char>>(poVar4);
      abort();
    }
  }
  fVar7 = (fVar6 + 2.0) * (fVar6 + 1.0) * fVar6;
  fVar5 = (float)((uint)fVar7 & 0x7fffff | 0x3f000000);
  fVar8 = fVar6 + 3.0;
  fVar3 = (float)((uint)fVar8 & 0x7fffff | 0x3f000000);
  fVar6 = ((fVar3 * -1.4980303 + (float)(uint)fVar8 * 1.1920929e-07 + -124.22545) -
          1.72588 / (fVar3 + 0.35208872)) * 0.6931472 * (fVar6 + 2.5) +
          ((0.0833333 / fVar8 + (-2.0810614 - fVar6)) -
          ((fVar5 * -1.4980303 + (float)(uint)fVar7 * 1.1920929e-07 + -124.22545) -
          1.72588 / (fVar5 + 0.35208872)) * 0.6931472);
  local_18._4_4_ = 0;
LAB_00195f4b:
  return (double)CONCAT44(local_18._4_4_,fVar6);
}

Assistant:

float lda::lgamma(float x)
{
  switch (mmode)
  {
    case USE_FAST_APPROX:
      // std::cerr << "lda::lgamma FAST_APPROX ";
      return ldamath::lgamma<float, USE_FAST_APPROX>(x);
    case USE_PRECISE:
      // std::cerr << "lda::lgamma PRECISE ";
      return ldamath::lgamma<float, USE_PRECISE>(x);
    case USE_SIMD:
      // std::cerr << "lda::gamma SIMD ";
      return ldamath::lgamma<float, USE_SIMD>(x);
    default:
      std::cerr << "lda::lgamma: Trampled or invalid math mode, aborting" << std::endl;
      abort();
      return 0.0f;
  }
}